

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferAttachmentLayeredCase::iterate
          (FramebufferAttachmentLayeredCase *this)

{
  ostringstream *poVar1;
  CaseType CVar2;
  TestLog *log;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  GLenum GVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar6;
  undefined4 extraout_var_01;
  char *pcVar7;
  long lVar8;
  GLint layer;
  GLint layered;
  Texture texture;
  Enum<int,_2UL> local_200;
  ScopedLogSection section;
  Framebuffer fbo;
  CallLogWrapper gl;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  iVar4 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  gl.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  lVar8 = 0;
  do {
    log = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode
          .m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,iterate::textureTypes[lVar8].name,(allocator<char> *)&texture);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fbo,iterate::textureTypes[lVar8].description,(allocator<char> *)&local_200
              );
    tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1b0,(string *)&fbo);
    if (fbo.super_ObjectWrapper.m_gl != (Functions *)&fbo.super_ObjectWrapper.m_object) {
      operator_delete(fbo.super_ObjectWrapper.m_gl,
                      CONCAT44(fbo.super_ObjectWrapper._20_4_,fbo.super_ObjectWrapper.m_object) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    iVar4 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    pOVar6 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper
              ((ObjectWrapper *)&fbo,(Functions *)CONCAT44(extraout_var_00,iVar4),pOVar6);
    iVar4 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    pOVar6 = glu::objectTraits(OBJECTTYPE_TEXTURE);
    glu::ObjectWrapper::ObjectWrapper
              (&texture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar4),pOVar6);
    layered = -1;
    glu::CallLogWrapper::glBindFramebuffer(&gl,0x8ca9,fbo.super_ObjectWrapper.m_object);
    CVar2 = iterate::textureTypes[lVar8].type;
    switch(CVar2) {
    case TEXTURE_3D:
    case TEXTURE_3D_LAYER:
      glu::CallLogWrapper::glBindTexture(&gl,0x806f,texture.super_ObjectWrapper.m_object);
      glu::CallLogWrapper::glTexImage3D
                (&gl,0x806f,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
      glu::CallLogWrapper::glTexParameteri(&gl,0x806f,0x2800,0x2600);
      glu::CallLogWrapper::glTexParameteri(&gl,0x806f,0x2801,0x2600);
      layer = 2;
      if (CVar2 == TEXTURE_3D) goto LAB_013d9f62;
LAB_013d9e48:
      glu::CallLogWrapper::glFramebufferTextureLayer
                (&gl,0x8ca9,0x8ce0,texture.super_ObjectWrapper.m_object,0,layer);
      break;
    case TEXTURE_2D_ARRAY:
    case TEXTURE_2D_ARRAY_LAYER:
      glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,texture.super_ObjectWrapper.m_object);
      glu::CallLogWrapper::glTexImage3D
                (&gl,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
      glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2800,0x2600);
      glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2801,0x2600);
      layer = 3;
      if (CVar2 != TEXTURE_2D_ARRAY) goto LAB_013d9e48;
      goto LAB_013d9f62;
    case TEXTURE_CUBE:
      glu::CallLogWrapper::glBindTexture(&gl,0x8513,texture.super_ObjectWrapper.m_object);
      GVar5 = 0x8515;
      do {
        glu::CallLogWrapper::glTexImage2D(&gl,GVar5,0,0x8058,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
        GVar5 = GVar5 + 1;
      } while (GVar5 != 0x851b);
      glu::CallLogWrapper::glTexParameteri(&gl,0x8513,0x2800,0x2600);
      glu::CallLogWrapper::glTexParameteri(&gl,0x8513,0x2801,0x2600);
LAB_013d9f62:
      glu::CallLogWrapper::glFramebufferTexture
                (&gl,0x8ca9,0x8ce0,texture.super_ObjectWrapper.m_object,0);
      break;
    case TEXTURE_2D_MS_ARRAY:
      ctxType.super_ApiType.m_bits =
           (ApiType)(*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                      m_renderCtx->_vptr_RenderContext[2])();
      bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
      if ((bVar3) ||
         (bVar3 = glu::ContextInfo::isExtensionSupported
                            (((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)
                             ->m_contextInfo,"GL_OES_texture_storage_multisample_2d_array"), bVar3))
      {
        glu::CallLogWrapper::glBindTexture(&gl,0x9102,texture.super_ObjectWrapper.m_object);
        glu::CallLogWrapper::glTexStorage3DMultisample(&gl,0x9102,1,0x8058,0x20,0x20,0x20,'\0');
        goto LAB_013d9f62;
      }
      local_1b0._0_8_ =
           ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "Context is not equal or greather than 3.2 and GL_OES_texture_storage_multisample_2d_array not supported, skipping."
                 ,0x72);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      goto LAB_013da1be;
    }
    GVar5 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar5,"setup attachment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x13f6);
    glu::CallLogWrapper::glGetFramebufferAttachmentParameteriv(&gl,0x8ca9,0x8ce0,0x8da7,&layered);
    GVar5 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar5,"getFramebufferParameteriv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x13f9);
    local_1b0._0_8_ =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_FRAMEBUFFER_ATTACHMENT_LAYERED = ",0x24);
    local_200.m_getName = glu::getBooleanName;
    local_200.m_value = layered;
    tcu::Format::Enum<int,_2UL>::toStream(&local_200,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
    if ((uint)layered < 2) {
      bVar3 = iterate::textureTypes[lVar8].layered;
      if (bVar3 != (layered == 1)) {
        local_1b0._0_8_ =
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Error, expected ",0x10);
        pcVar7 = "mapped_ == GL_FALSE";
        if (bVar3 != false) {
          pcVar7 = "mapped_ == GL_TRUE";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,pcVar7 + 0xb,8 - (ulong)bVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
        local_200.m_getName = glu::getBooleanName;
        local_200.m_value = layered;
        tcu::Format::Enum<int,_2UL>::toStream(&local_200,(ostream *)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        pcVar7 = "invalid layer count";
        goto LAB_013da1b0;
      }
    }
    else {
      local_1b0._0_8_ =
           ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Error, expected boolean, got ",0x1d);
      std::ostream::operator<<(poVar1,layered);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      pcVar7 = "invalid boolean";
LAB_013da1b0:
      tcu::TestContext::setTestResult
                ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,pcVar7);
    }
LAB_013da1be:
    glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&fbo);
    tcu::TestLog::endSection(section.m_log);
    lVar8 = lVar8 + 1;
    if (lVar8 == 6) {
      glu::CallLogWrapper::~CallLogWrapper(&gl);
      return STOP;
    }
  } while( true );
}

Assistant:

FramebufferAttachmentLayeredCase::IterateResult FramebufferAttachmentLayeredCase::iterate (void)
{
	enum CaseType
	{
		TEXTURE_3D,
		TEXTURE_2D_ARRAY,
		TEXTURE_CUBE,
		TEXTURE_2D_MS_ARRAY,
		TEXTURE_3D_LAYER,
		TEXTURE_2D_ARRAY_LAYER,
	};

	static const struct TextureType
	{
		const char*	name;
		const char*	description;
		bool		layered;
		CaseType	type;
	} textureTypes[] =
	{
		{ "3D",				"3D texture",			true,	TEXTURE_3D				},
		{ "2DArray",		"2D array",				true,	TEXTURE_2D_ARRAY		},
		{ "Cube",			"Cube map",				true,	TEXTURE_CUBE			},
		{ "2DMSArray",		"2D multisample array",	true,	TEXTURE_2D_MS_ARRAY		},
		{ "3DLayer",		"3D texture layer ",	false,	TEXTURE_3D_LAYER		},
		{ "2DArrayLayer",	"2D array layer ",		false,	TEXTURE_2D_ARRAY_LAYER	},
	};

	glu::CallLogWrapper gl(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	gl.enableLogging(true);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(textureTypes); ++ndx)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), textureTypes[ndx].name, textureTypes[ndx].description);
		const glu::Framebuffer		fbo				(m_context.getRenderContext());
		const glu::Texture			texture			(m_context.getRenderContext());
		glw::GLint					layered			= -1;

		gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);

		if (textureTypes[ndx].type == TEXTURE_3D || textureTypes[ndx].type == TEXTURE_3D_LAYER)
		{
			gl.glBindTexture(GL_TEXTURE_3D, *texture);
			gl.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

			if (textureTypes[ndx].type == TEXTURE_3D)
				gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
			else
				gl.glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0, 2);
		}
		else if (textureTypes[ndx].type == TEXTURE_2D_ARRAY || textureTypes[ndx].type == TEXTURE_2D_ARRAY_LAYER)
		{
			gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture);
			gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

			if (textureTypes[ndx].type == TEXTURE_2D_ARRAY)
				gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
			else
				gl.glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0, 3);
		}
		else if (textureTypes[ndx].type == TEXTURE_CUBE)
		{
			gl.glBindTexture(GL_TEXTURE_CUBE_MAP, *texture);
			for (int face = 0; face < 6; ++face)
				gl.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			gl.glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
		}
		else if (textureTypes[ndx].type == TEXTURE_2D_MS_ARRAY)
		{
			// check extension
			if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Context is not equal or greather than 3.2 and GL_OES_texture_storage_multisample_2d_array not supported, skipping." << tcu::TestLog::EndMessage;
				continue;
			}

			gl.glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, *texture);
			gl.glTexStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 1, GL_RGBA8, 32, 32, 32, GL_FALSE);
			gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
		}

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup attachment");

		gl.glGetFramebufferAttachmentParameteriv(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_LAYERED, &layered);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "getFramebufferParameteriv");

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_FRAMEBUFFER_ATTACHMENT_LAYERED = " << glu::getBooleanStr(layered) << tcu::TestLog::EndMessage;

		if (layered != GL_TRUE && layered != GL_FALSE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected boolean, got " << layered << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid boolean");
		}
		else if ((layered == GL_TRUE) != textureTypes[ndx].layered)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected " << ((textureTypes[ndx].layered) ? ("GL_TRUE") : ("GL_FALSE")) << ", got " << glu::getBooleanStr(layered) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid layer count");
		}
	}

	return STOP;
}